

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O0

void * lqFindNearestNeighborWithinRadius
                 (lqInternalDB *lq,float x,float y,float z,float radius,void *ignoreObject)

{
  lqFindNearestState lqFNS;
  
  lqMapOverAllObjectsInLocality
            ((lqInternalDB *)CONCAT44(z,radius),ignoreObject._4_4_,ignoreObject._0_4_,
             (float)lqFNS._20_4_,lqFNS.minDistanceSquared,(lqCallBackFunction)lqFNS.nearestObject,
             lqFNS.ignoreObject);
  return (void *)0x0;
}

Assistant:

void* lqFindNearestNeighborWithinRadius (lqInternalDB* lq, 
					 float x, float y, float z,
					 float radius,
					 void* ignoreObject)
{
    /* initialize search state */
    lqFindNearestState lqFNS;
    lqFNS.nearestObject = NULL;
    lqFNS.ignoreObject = ignoreObject;
    lqFNS.minDistanceSquared = FLT_MAX;

    /* map search helper function over all objects within radius */
    lqMapOverAllObjectsInLocality (lq, 
				   x, y, z,
				   radius,
				   lqFindNearestHelper,
				   &lqFNS);

    /* return nearest object found, if any */
    return lqFNS.nearestObject;
}